

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_fp16.h
# Opt level: O0

void ncnn::cast_fp32_to_fp16_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 *puVar1;
  unsigned_short uVar2;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  __m128h _v_fp16_2;
  __m128 _v_fp32_2;
  __m128h _v_fp16_1;
  __m256 _v_fp32_1;
  __m256h _v_fp16;
  __m512 _v_fp32;
  int i;
  unsigned_short *outptr;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  int local_424;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined4 local_408;
  long local_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined8 local_3e0;
  undefined1 (*local_3d8) [32];
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  long local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined8 local_380;
  undefined1 (*local_378) [64];
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  int local_358;
  int local_354;
  long *local_348;
  long *local_340;
  undefined1 local_335;
  int local_334;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 *local_310;
  undefined8 *local_300;
  undefined1 local_2ed;
  int local_2ec;
  undefined8 *local_2e0;
  undefined8 *local_2d0;
  undefined1 (*local_2c8) [64];
  undefined1 local_2c0 [64];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 (*local_230) [32];
  undefined1 (*local_228) [64];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 (*local_1e0) [32];
  undefined1 (*local_1d8) [64];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [16];
  undefined1 (*local_1a8) [32];
  long local_1a0;
  undefined4 local_194;
  long local_190;
  undefined1 (*local_188) [32];
  undefined4 local_17c;
  int local_178;
  int local_174;
  undefined8 *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  undefined1 (*local_150) [64];
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  undefined4 local_12c;
  long local_128;
  undefined4 local_11c;
  long local_118;
  undefined8 *local_e8;
  undefined8 *local_c8;
  undefined1 local_80 [32];
  
  local_354 = *(int *)((long)in_RDI + 0x2c);
  local_358 = (int)in_RDI[6];
  local_35c = *(int *)((long)in_RDI + 0x34);
  local_360 = (int)in_RDI[7];
  local_364 = (int)in_RDI[3];
  local_368 = local_354 * local_358 * local_35c * local_364;
  local_348 = in_RSI;
  local_340 = in_RDI;
  for (local_36c = 0; local_36c < local_360; local_36c = local_36c + 1) {
    local_328 = &local_3c0;
    local_13c = *(int *)((long)local_340 + 0x2c);
    local_140 = (int)local_340[6];
    local_144 = *(undefined4 *)((long)local_340 + 0x34);
    local_150 = (undefined1 (*) [64])(*local_340 + local_340[8] * (long)local_36c * local_340[2]);
    local_158 = local_340[2];
    local_15c = (undefined4)local_340[3];
    local_168 = local_340[4];
    local_138 = &local_3c0;
    local_128 = (long)local_13c * (long)local_140 * local_158;
    local_320 = &local_3c0;
    local_310 = &local_3c0;
    local_2e0 = &local_420;
    local_174 = *(int *)((long)local_348 + 0x2c);
    local_178 = (int)local_348[6];
    local_17c = *(undefined4 *)((long)local_348 + 0x34);
    local_188 = (undefined1 (*) [32])(*local_348 + local_348[8] * (long)local_36c * local_348[2]);
    local_190 = local_348[2];
    local_194 = (undefined4)local_348[3];
    local_1a0 = local_348[4];
    local_170 = &local_420;
    local_118 = (long)local_174 * (long)local_178 * local_190;
    local_2d0 = &local_420;
    local_300 = &local_420;
    local_388 = 0;
    local_38c = 0;
    local_390 = 0;
    local_394 = 0;
    local_3a8 = 0;
    local_3b0 = 0;
    local_3b8 = 0;
    local_3c0 = 0;
    local_11c = 0x10;
    local_12c = 0x10;
    local_2ec = local_36c;
    local_2ed = 1;
    local_334 = local_36c;
    local_335 = 1;
    local_380 = 0;
    local_398 = 0;
    local_420 = 0;
    local_410 = 0;
    local_408 = 0;
    local_3f8 = 0;
    local_3f4 = 0;
    local_3f0 = 0;
    local_3ec = 0;
    local_3e8 = 0;
    local_3e0 = 0;
    local_418 = 0;
    local_3d8 = local_188;
    local_378 = local_150;
    for (local_424 = 0; local_424 + 0xf < local_368; local_424 = local_424 + 0x10) {
      local_2c8 = local_378;
      local_2c0 = *local_378;
      auVar4 = vcvtps2phx_avx512fp16(local_2c0);
      local_80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      local_230 = local_3d8;
      local_4a0 = auVar4._0_8_;
      local_260 = local_4a0;
      uStack_498 = auVar4._8_8_;
      uStack_258 = uStack_498;
      uStack_490 = auVar4._16_8_;
      uStack_250 = uStack_490;
      uStack_488 = auVar4._24_8_;
      uStack_248 = uStack_488;
      *local_3d8 = auVar4;
      local_378 = local_378 + 1;
      local_3d8 = local_3d8 + 1;
    }
    for (; local_424 + 7 < local_368; local_424 = local_424 + 8) {
      local_228 = local_378;
      local_220 = *(undefined8 *)*local_378;
      uStack_218 = *(undefined8 *)(*local_378 + 8);
      uStack_210 = *(undefined8 *)(*local_378 + 0x10);
      uStack_208 = *(undefined8 *)(*local_378 + 0x18);
      auVar3 = vcvtps2phx_avx512fp16(*(undefined1 (*) [32])*local_378);
      local_1e0 = local_3d8;
      local_4d0 = auVar3._0_8_;
      local_1f0 = local_4d0;
      uStack_4c8 = auVar3._8_8_;
      uStack_1e8 = uStack_4c8;
      *(undefined1 (*) [16])*local_3d8 = auVar3;
      local_378 = (undefined1 (*) [64])(*local_378 + 0x20);
      local_3d8 = (undefined1 (*) [32])(*local_3d8 + 0x10);
    }
    for (; local_e8 = local_300, local_c8 = local_310, local_400 = local_1a0, local_3a0 = local_168,
        local_424 + 3 < local_368; local_424 = local_424 + 4) {
      local_1d8 = local_378;
      local_1d0 = *(undefined8 *)*local_378;
      uStack_1c8 = *(undefined8 *)(*local_378 + 8);
      auVar3 = vcvtps2phx_avx512fp16(*(undefined1 (*) [16])*local_378);
      local_1a8 = local_3d8;
      local_1c0._8_8_ = 0;
      local_1c0._0_8_ = auVar3._0_8_;
      *(ulong *)*local_3d8 = auVar3._0_8_;
      local_378 = (undefined1 (*) [64])(*local_378 + 0x10);
      local_3d8 = (undefined1 (*) [32])(*local_3d8 + 8);
    }
    for (; local_424 < local_368; local_424 = local_424 + 1) {
      puVar1 = *local_378;
      local_378 = (undefined1 (*) [64])(*local_378 + 4);
      uVar2 = float32_to_float16(*(float *)puVar1);
      *(unsigned_short *)*local_3d8 = uVar2;
      local_3d8 = (undefined1 (*) [32])(*local_3d8 + 2);
    }
  }
  return;
}

Assistant:

static void cast_fp32_to_fp16_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512FP16 && __AVX512F__ && !__AVX512FP16__
    if (ncnn::cpu_support_x86_avx512_fp16())
    {
        cast_fp32_to_fp16_sse_avx512fp16(bottom_blob, top_blob, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        cast_fp32_to_fp16_sse_f16c(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        unsigned short* outptr = top_blob.channel(q);

        int i = 0;
#if __AVX512FP16__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v_fp32 = _mm512_loadu_ps(ptr);
            __m256h _v_fp16 = _mm512_cvtxps_ph(_v_fp32);
            _mm256_storeu_si256((__m256i*)outptr, (__m256i)_v_fp16);

            ptr += 16;
            outptr += 16;
        }
        for (; i + 7 < size; i += 8)
        {
            __m256 _v_fp32 = _mm256_loadu_ps(ptr);
            __m128h _v_fp16 = _mm256_cvtxps_ph(_v_fp32);
            _mm_storeu_si128((__m128i*)outptr, (__m128i)_v_fp16);

            ptr += 8;
            outptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v_fp32 = _mm_loadu_ps(ptr);
            __m128h _v_fp16 = _mm_cvtxps_ph(_v_fp32);
            _mm_storel_epi64((__m128i*)outptr, (__m128i)_v_fp16);

            ptr += 4;
            outptr += 4;
        }
#elif __F16C__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v_fp32 = _mm256_loadu_ps(ptr);
            __m128i _v_fp16 = _mm256_cvtps_ph(_v_fp32, _MM_FROUND_TRUNC);
            _mm_storeu_si128((__m128i*)outptr, _v_fp16);

            ptr += 8;
            outptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v_fp32 = _mm_loadu_ps(ptr);
            __m128i _v_fp16 = _mm_cvtps_ph(_v_fp32, _MM_FROUND_TRUNC);
            _mm_storel_epi64((__m128i*)outptr, _v_fp16);

            ptr += 4;
            outptr += 4;
        }
#endif
        for (; i < size; i++)
        {
            *outptr++ = float32_to_float16(*ptr++);
        }
    }
}